

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::
     throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,std::fpos<__mbstate_t>,char_const*,std::fpos<__mbstate_t>>
               (char *args,path *args_1,char *args_2,fpos<__mbstate_t> args_3,char *args_4,
               fpos<__mbstate_t> args_5)

{
  Exception *this;
  string local_248;
  streamoff local_228;
  __mbstate_t _Stack_220;
  streamoff local_218;
  __mbstate_t _Stack_210;
  path local_1f0;
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
  local_1c1;
  stringstream local_1c0 [8];
  stringstream msg;
  char *args_local_4;
  char *args_local_2;
  path *args_local_1;
  char *args_local;
  fpos<__mbstate_t> args_local_3;
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  std::filesystem::__cxx11::path::path(&local_1f0,args_1);
  local_228 = args_5._M_off;
  _Stack_220 = args_5._M_state;
  local_218 = args_3._M_off;
  _Stack_210 = args_3._M_state;
  detail::
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
  ::operator()(&local_1c1,(stringstream *)local_1c0,args,&local_1f0,args_2,args_3,args_4,args_5);
  std::filesystem::__cxx11::path::~path(&local_1f0);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_248);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}